

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnCatch(TypeChecker *this)

{
  bool bVar1;
  Type local_3c;
  Enum local_38;
  Enum local_34;
  Enum local_30;
  Enum local_2c;
  Label *local_28;
  Label *label;
  TypeChecker *pTStack_18;
  Result result;
  TypeChecker *this_local;
  
  pTStack_18 = this;
  Result::Result((Result *)((long)&label + 4),Ok);
  local_2c = (Enum)TopLabel(this,&local_28);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_30 = (Enum)CheckLabelType(this,local_28,Try);
    Result::operator|=((Result *)((long)&label + 4),(Result)local_30);
    local_34 = (Enum)PopAndCheckSignature(this,&local_28->result_types,"try block");
    Result::operator|=((Result *)((long)&label + 4),(Result)local_34);
    local_38 = (Enum)CheckTypeStackEnd(this,"try block");
    Result::operator|=((Result *)((long)&label + 4),(Result)local_38);
    ResetTypeStackToLabel(this,local_28);
    local_28->label_type = Catch;
    local_28->unreachable = false;
    Type::Type(&local_3c,ExnRef);
    PushType(this,local_3c);
    this_local._4_4_ = label._4_4_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnCatch() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::Try);
  result |= PopAndCheckSignature(label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(label);
  label->label_type = LabelType::Catch;
  label->unreachable = false;
  PushType(Type::ExnRef);
  return result;
}